

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool __thiscall
ON_3dVector::IsPerpendicularTo(ON_3dVector *this,ON_3dVector *v,double angle_tolerance)

{
  double x;
  double y;
  double z;
  double x_00;
  double y_00;
  double z_00;
  double dVar1;
  double dVar2;
  double dVar3;
  
  x = this->x;
  y = this->y;
  z = this->z;
  dVar1 = ON_Length3d(x,y,z);
  x_00 = v->x;
  y_00 = v->y;
  z_00 = v->z;
  dVar2 = ON_Length3d(x_00,y_00,z_00);
  if ((0.0 < dVar2 * dVar1) &&
     (dVar3 = sin(angle_tolerance), ABS((z * z_00 + x * x_00 + y * y_00) / (dVar2 * dVar1)) <= dVar3
     )) {
    return true;
  }
  return false;
}

Assistant:

bool ON_3dVector::IsPerpendicularTo(
      // returns true:  this and other vectors are perpendicular
      //         false: this and other vectors are not perpendicular
      //                or at least one of the vectors is zero
      const ON_3dVector& v,
      double angle_tolerance // (default=ON_DEFAULT_ANGLE_TOLERANCE) radians
      ) const
{
  bool rc = false;
  const double ll = Length()*v.Length();
  if ( ll > 0.0 ) {
    if ( fabs((x*v.x + y*v.y + z*v.z)/ll) <= sin(angle_tolerance) )
      rc = true;
  }
  return rc;
}